

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O2

float64 set_best_quest(dtree_node_t *node,float32 ****mixw,float32 ****means,float32 ****vars,
                      uint32 *veclen,uint32 n_model,uint32 n_state,uint32 n_stream,uint32 n_density,
                      float32 *stwt,quest_t *all_q,uint32 n_all_q,pset_t *pset,uint32 **dfeat,
                      uint32 n_dfeat,float32 mwfloor)

{
  float32 ***dist;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong d2;
  ulong d3;
  float64 fVar4;
  float fVar5;
  double dVar6;
  float32 fVar7;
  
  d3 = (ulong)n_density;
  d2 = (ulong)n_stream;
  dist = (float32 ***)
         __ckd_calloc_3d__((ulong)n_state,d2,d3,4,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                           ,0x3bb);
  for (uVar1 = 0; uVar1 != n_state; uVar1 = uVar1 + 1) {
    for (uVar2 = 0; uVar2 != d2; uVar2 = uVar2 + 1) {
      for (uVar3 = 0; d3 != uVar3; uVar3 = uVar3 + 1) {
        dist[uVar1][uVar2][uVar3] = node->mixw_occ[uVar1][uVar2][uVar3];
      }
    }
    dVar6 = 0.0;
    for (uVar2 = 0; d3 != uVar2; uVar2 = uVar2 + 1) {
      dVar6 = dVar6 + (double)(float)(*dist[uVar1])[uVar2];
    }
    for (uVar2 = 0; uVar2 != d2; uVar2 = uVar2 + 1) {
      for (uVar3 = 0; d3 != uVar3; uVar3 = uVar3 + 1) {
        fVar5 = (float)((double)(float)dist[uVar1][uVar2][uVar3] * (1.0 / dVar6));
        fVar7 = mwfloor;
        if ((float)mwfloor <= fVar5) {
          fVar7 = (float32)fVar5;
        }
        dist[uVar1][uVar2][uVar3] = fVar7;
      }
    }
  }
  fVar4 = best_q(mixw,means,vars,veclen,n_model,n_state,n_stream,n_density,stwt,dfeat,n_dfeat,all_q,
                 n_all_q,pset,node->id,node->n_id,dist,node->wt_ent,(quest_t **)&node->q);
  node->wt_ent_dec = fVar4;
  ckd_free_3d(dist);
  return node->wt_ent_dec;
}

Assistant:

float64
set_best_quest(dtree_node_t *node,
	       float32 ****mixw,
               float32 ****means,
               float32 ****vars,
               uint32  *veclen,
	       uint32 n_model,
	       uint32 n_state,
	       uint32 n_stream,
	       uint32 n_density,
	       float32 *stwt,

	       quest_t *all_q,
	       uint32 n_all_q,
	       pset_t *pset,

	       uint32 **dfeat,
	       uint32 n_dfeat,

	       float32 mwfloor)
{
    float32 ***dist;
    float64 norm;
    uint32 s, j, k;
    
    dist = (float32 ***)ckd_calloc_3d(n_state, n_stream, n_density, sizeof(float32));

    /* Convert occ. counts to probabilities. norm now has total occ. count */
    for (s = 0; s < n_state; s++) {
	for (j = 0; j < n_stream; j++) {
	    for (k = 0; k < n_density; k++) {
		dist[s][j][k] = node->mixw_occ[s][j][k];
	    }
	}
	for (k = 0, norm = 0; k < n_density; k++) {
	    norm += dist[s][0][k];
	}
	norm = 1.0 / norm;
	for (j = 0; j < n_stream; j++) {
	    for (k = 0; k < n_density; k++) {
		dist[s][j][k] *= norm;
		if (dist[s][j][k] < mwfloor) {
		    dist[s][j][k] = mwfloor;
		}
	    }
	}
    }

    node->wt_ent_dec = best_q(mixw, means, vars, veclen,
                              n_model, n_state, n_stream, n_density,
			      stwt,
			      dfeat, n_dfeat,
			      all_q, n_all_q,
			      pset,
			      node->id, node->n_id,
			      dist, node->wt_ent,
			      (quest_t **)&node->q);

    ckd_free_3d((void ***)dist);

    return node->wt_ent_dec;
}